

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

string * inject_top_level_storage_qualifier
                   (string *__return_storage_ptr__,string *expr,string *qualifier)

{
  ulong uVar1;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  ulong uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  uVar1 = std::__cxx11::string::rfind((char)expr,0x26);
  uVar2 = std::__cxx11::string::rfind((char)expr,0x2a);
  uVar3 = uVar2;
  if (((uVar1 != 0xffffffffffffffff) && (uVar3 = uVar1, uVar2 != 0xffffffffffffffff)) &&
     (uVar3 = uVar2, uVar2 < uVar1)) {
    uVar3 = uVar1;
  }
  if (uVar3 == 0xffffffffffffffff) {
    spirv_cross::join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
              (__return_storage_ptr__,(spirv_cross *)qualifier,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d8129,
               (char (*) [2])expr,in_R8);
  }
  else {
    std::__cxx11::string::substr((ulong)local_48,(ulong)expr);
    std::__cxx11::string::substr((ulong)&local_68,(ulong)expr);
    spirv_cross::
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
              (__return_storage_ptr__,(spirv_cross *)local_48,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3d8129,
               (char (*) [2])qualifier,&local_68,in_R9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static string inject_top_level_storage_qualifier(const string &expr, const string &qualifier)
{
	// Easier to do this through text munging since the qualifier does not exist in the type system at all,
	// and plumbing in all that information is not very helpful.
	size_t last_reference = expr.find_last_of('&');
	size_t last_pointer = expr.find_last_of('*');
	size_t last_significant = string::npos;

	if (last_reference == string::npos)
		last_significant = last_pointer;
	else if (last_pointer == string::npos)
		last_significant = last_reference;
	else
		last_significant = max<size_t>(last_reference, last_pointer);

	if (last_significant == string::npos)
		return join(qualifier, " ", expr);
	else
	{
		return join(expr.substr(0, last_significant + 1), " ",
		            qualifier, expr.substr(last_significant + 1, string::npos));
	}
}